

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* JSON::parseJSONMap(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *__return_storage_ptr__,string *json)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  int iVar3;
  pointer pcVar4;
  bool bVar5;
  mapped_type *pmVar6;
  int iVar7;
  char *pcVar8;
  char cVar9;
  key_type *pkVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  string strKey;
  string strVal;
  key_type local_70;
  key_type local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (*(json->_M_dataplus)._M_p == '{') {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    iVar3 = (int)json->_M_string_length;
    if (1 < iVar3) {
      uVar13 = 1;
      bVar14 = false;
      bVar5 = false;
      do {
        iVar11 = (int)uVar13;
        pcVar4 = (json->_M_dataplus)._M_p;
        if (bVar14) {
          if ((pcVar4[iVar11] == '\"') && (pcVar4[(long)iVar11 + -1] != '\\')) {
            if (bVar5) {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](__return_storage_ptr__,&local_70);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              std::__cxx11::string::_M_replace
                        ((ulong)&local_70,0,(char *)local_70._M_string_length,0x165c05);
              bVar5 = false;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_50,0,(char *)local_50._M_string_length,0x165c05);
              bVar14 = false;
            }
            else {
              iVar7 = iVar11 + 1;
              pcVar8 = pcVar4 + iVar11;
              do {
                pcVar8 = pcVar8 + 1;
                iVar7 = iVar7 + 1;
              } while (*pcVar8 == ' ');
              uVar13 = (ulong)iVar7;
              while( true ) {
                cVar2 = pcVar4[uVar13];
                if (cVar2 != ' ') break;
                uVar13 = uVar13 + 1;
              }
              if (cVar2 != '\"') {
                cVar9 = (char)&local_50;
                if (cVar2 == '[') {
                  for (; (json->_M_dataplus)._M_p[uVar13] != ']'; uVar13 = uVar13 + 1) {
                    std::__cxx11::string::push_back(cVar9);
                  }
                  std::__cxx11::string::push_back(cVar9);
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](__return_storage_ptr__,&local_70);
                  std::__cxx11::string::_M_assign((string *)pmVar6);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_70,0,(char *)local_70._M_string_length,0x165c05);
                  bVar5 = false;
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_50,0,(char *)local_50._M_string_length,0x165c05);
                }
                else {
                  for (; (cVar2 = (json->_M_dataplus)._M_p[uVar13], cVar2 != ',' && (cVar2 != '}'));
                      uVar13 = uVar13 + 1) {
                    std::__cxx11::string::push_back(cVar9);
                  }
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](__return_storage_ptr__,&local_70);
                  std::__cxx11::string::_M_assign((string *)pmVar6);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_70,0,(char *)local_70._M_string_length,0x165c05);
                  bVar5 = false;
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_50,0,(char *)local_50._M_string_length,0x165c05);
                }
                goto LAB_0010aa93;
              }
              bVar5 = true;
              bVar14 = true;
            }
          }
          else {
            pkVar10 = &local_50;
            if (!bVar5) {
              pkVar10 = &local_70;
            }
            bVar14 = true;
            std::__cxx11::string::push_back((char)pkVar10);
          }
        }
        else if (pcVar4[iVar11] == '\"') {
          bVar14 = pcVar4[(long)iVar11 + -1] != '\\';
        }
        else {
LAB_0010aa93:
          bVar14 = false;
        }
        uVar12 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar12;
      } while ((int)uVar12 < iVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> parseJSONMap(const std::string & json) {
    std::map<std::string, std::string> res;
    if (json[0] != '{') return res;

    bool hasKey = false;
    bool inToken = false;

    std::string strKey = "";
    std::string strVal = "";

    int n = json.size();
    for (int i = 1; i < n; ++i) {
        if (!inToken) {
            if (json[i] == ' ') continue;
            if (json[i] == '"' && json[i-1] != '\\') {
                inToken = true;
                continue;
            }
        } else {
            if (json[i] == '"' && json[i-1] != '\\') {
                if (hasKey == false) {
                    hasKey = true;
                    ++i;
                    while (json[i] == ' ') ++i;
                    ++i; // :
                    while (json[i] == ' ') ++i;
                    if (json[i] == '[') {
                        while (json[i] != ']') {
                            strVal += json[i++];
                        }
                        strVal += ']';
                        hasKey = false;
                        res[strKey] = strVal;
                        strKey = "";
                        strVal = "";
                    } else if (json[i] != '\"') {
                        while (json[i] != ',' && json[i] != '}') {
                            strVal += json[i++];
                        }
                        hasKey = false;
                        res[strKey] = strVal;
                        strKey = "";
                        strVal = "";
                    } else {
                        inToken = true;
                        continue;
                    }
                } else {
                    hasKey = false;
                    res[strKey] = strVal;
                    strKey = "";
                    strVal = "";
                }
                inToken = false;
                continue;
            }
            if (hasKey == false) {
                strKey += json[i];
            } else {
                strVal += json[i];
            }
        }
    }

    return res;
}